

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool draco::GeometryAttribute::ConvertComponentValue<float,unsigned_int>
               (float *in_value,bool normalized,uint *out_value)

{
  float fVar1;
  uint uVar2;
  undefined4 *in_RDX;
  byte in_SIL;
  float *in_RDI;
  double dVar3;
  
  uVar2 = std::isnan((double)(ulong)(uint)*in_RDI);
  if (((uVar2 & 1) != 0) || (uVar2 = std::isinf((double)(ulong)(uint)*in_RDI), (uVar2 & 1) != 0)) {
    return false;
  }
  fVar1 = *in_RDI;
  uVar2 = std::numeric_limits<unsigned_int>::min();
  if (((float)uVar2 <= fVar1) &&
     (fVar1 = *in_RDI, uVar2 = std::numeric_limits<unsigned_int>::max(), fVar1 < (float)uVar2)) {
    if ((in_SIL & 1) == 0) {
      *in_RDX = (int)(long)*in_RDI;
    }
    else {
      if ((1.0 < *in_RDI) || (*in_RDI <= 0.0 && *in_RDI != 0.0)) {
        return false;
      }
      fVar1 = *in_RDI;
      uVar2 = std::numeric_limits<unsigned_int>::max();
      dVar3 = floor((double)fVar1 * (double)uVar2 + 0.5);
      *in_RDX = (int)(long)dVar3;
    }
    return true;
  }
  return false;
}

Assistant:

static bool ConvertComponentValue(const T &in_value, bool normalized,
                                    OutT *out_value) {
    // Make sure the |in_value| can be represented as an integral type OutT.
    if (std::is_integral<OutT>::value) {
      // Make sure the |in_value| fits within the range of values that OutT
      // is able to represent. Perform the check only for integral types.
      if (!std::is_same<T, bool>::value && std::is_integral<T>::value) {
        static constexpr OutT kOutMin =
            std::is_signed<T>::value ? std::numeric_limits<OutT>::min() : 0;
        if (in_value < kOutMin || in_value > std::numeric_limits<OutT>::max()) {
          return false;
        }
      }

      // Check conversion of floating point |in_value| to integral value OutT.
      if (std::is_floating_point<T>::value) {
        // Make sure the floating point |in_value| is not NaN and not Inf as
        // integral type OutT is unable to represent these values.
        if (sizeof(in_value) > sizeof(double)) {
          if (std::isnan(static_cast<long double>(in_value)) ||
              std::isinf(static_cast<long double>(in_value))) {
            return false;
          }
        } else if (sizeof(in_value) > sizeof(float)) {
          if (std::isnan(static_cast<double>(in_value)) ||
              std::isinf(static_cast<double>(in_value))) {
            return false;
          }
        } else {
          if (std::isnan(static_cast<float>(in_value)) ||
              std::isinf(static_cast<float>(in_value))) {
            return false;
          }
        }

        // Make sure the floating point |in_value| fits within the range of
        // values that integral type OutT is able to represent.
        if (in_value < std::numeric_limits<OutT>::min() ||
            in_value >= std::numeric_limits<OutT>::max()) {
          return false;
        }
      }
    }

    if (std::is_integral<T>::value && std::is_floating_point<OutT>::value &&
        normalized) {
      // When converting integer to floating point, normalize the value if
      // necessary.
      *out_value = static_cast<OutT>(in_value);
      *out_value /= static_cast<OutT>(std::numeric_limits<T>::max());
    } else if (std::is_floating_point<T>::value &&
               std::is_integral<OutT>::value && normalized) {
      // Converting from floating point to a normalized integer.
      if (in_value > 1 || in_value < 0) {
        // Normalized float values need to be between 0 and 1.
        return false;
      }
      // TODO(ostava): Consider allowing float to normalized integer conversion
      // for 64-bit integer types. Currently it doesn't work because we don't
      // have a floating point type that could store all 64 bit integers.
      if (sizeof(OutT) > 4) {
        return false;
      }
      // Expand the float to the range of the output integer and round it to the
      // nearest representable value. Use doubles for the math to ensure the
      // integer values are represented properly during the conversion process.
      *out_value = static_cast<OutT>(std::floor(
          in_value * static_cast<double>(std::numeric_limits<OutT>::max()) +
          0.5));
    } else {
      *out_value = static_cast<OutT>(in_value);
    }

    // TODO(ostava): Add handling of normalized attributes when converting
    // between different integer representations. If the attribute is
    // normalized, integer values should be converted as if they represent 0-1
    // range. E.g. when we convert uint16 to uint8, the range <0, 2^16 - 1>
    // should be converted to range <0, 2^8 - 1>.
    return true;
  }